

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Segment::ParseCues(Segment *this,longlong off,longlong *pos,long *len)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  Cues *this_00;
  long lVar4;
  long pos_00;
  longlong avail;
  longlong total;
  long local_58;
  long local_50;
  longlong local_48;
  long local_40;
  longlong local_38;
  
  if (this->m_pCues != (Cues *)0x0) {
    return 0;
  }
  if (off < 0) {
    return -1;
  }
  iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_40,&local_58);
  if (iVar1 < 0) {
    return (long)iVar1;
  }
  pos_00 = off + this->m_start;
  *pos = pos_00;
  if (local_40 <= pos_00 || local_40 < 0) {
    return 1;
  }
  lVar4 = -1;
  if (-1 < this->m_size) {
    lVar4 = this->m_start + this->m_size;
  }
  if (pos_00 < local_58) {
    lVar2 = GetUIntLength(this->m_pReader,pos_00,len);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (lVar2 == 0) {
      lVar3 = *len + *pos;
      if (-1 < lVar4 && lVar4 < lVar3) {
        return -2;
      }
      if (local_58 < lVar3) {
        return -3;
      }
      lVar2 = ReadID(this->m_pReader,*pos,len);
      if (lVar2 != 0x1c53bb6b) {
        return -2;
      }
      lVar3 = *pos + *len;
      *pos = lVar3;
      if (lVar3 < local_58) {
        lVar2 = GetUIntLength(this->m_pReader,lVar3,len);
        if (lVar2 < 0) {
          return lVar2;
        }
        if (lVar2 == 0) {
          lVar3 = *len + *pos;
          if (-1 < lVar4 && lVar4 < lVar3) {
            return -2;
          }
          if (local_58 < lVar3) {
            return -3;
          }
          local_48 = ReadUInt(this->m_pReader,*pos,len);
          if (local_48 < 0) {
            return local_48;
          }
          if (local_48 == 0) {
            return 1;
          }
          local_38 = *pos + *len;
          local_50 = local_48 + local_38;
          *pos = local_38;
          if ((-1 < lVar4) && (lVar4 < local_50)) {
            return -2;
          }
          if ((-1 < local_40) && (local_40 < local_50)) {
            return 1;
          }
          *len = local_48;
          if (local_50 <= local_58) {
            this_00 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
            if (this_00 != (Cues *)0x0) {
              Cues::Cues(this_00,this,local_38,local_48,pos_00,local_50 - pos_00);
            }
            this->m_pCues = this_00;
            return -(ulong)(this_00 == (Cues *)0x0);
          }
          return -3;
        }
      }
    }
  }
  *len = 1;
  return -3;
}

Assistant:

long Segment::ParseCues(long long off, long long& pos, long& len) {
  if (m_pCues)
    return 0;  // success

  if (off < 0)
    return -1;

  long long total, avail;

  const int status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = m_start + off;

  if ((total < 0) || (pos >= total))
    return 1;  // don't bother parsing cues

  const long long element_start = pos;
  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(m_pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // underflow (weird)
  {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  if ((segment_stop >= 0) && ((pos + len) > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long idpos = pos;

  const long long id = ReadID(m_pReader, idpos, len);

  if (id != libwebm::kMkvCues)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume ID
  assert((segment_stop < 0) || (pos <= segment_stop));

  // Read Size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(m_pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // underflow (weird)
  {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  if ((segment_stop >= 0) && ((pos + len) > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(m_pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(size);

  if (size == 0)  // weird, although technically not illegal
    return 1;  // done

  pos += len;  // consume length of size of element
  assert((segment_stop < 0) || (pos <= segment_stop));

  // Pos now points to start of payload

  const long long element_stop = pos + size;

  if ((segment_stop >= 0) && (element_stop > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && (element_stop > total))
    return 1;  // don't bother parsing anymore

  len = static_cast<long>(size);

  if (element_stop > avail)
    return E_BUFFER_NOT_FULL;

  const long long element_size = element_stop - element_start;

  m_pCues =
      new (std::nothrow) Cues(this, pos, size, element_start, element_size);
  if (m_pCues == NULL)
    return -1;

  return 0;  // success
}